

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rbuObjIterPrepareAll(sqlite3rbu *p,RbuObjIter *pIter,int nOffset)

{
  sqlite3 *psVar1;
  int iVar2;
  uint uVar3;
  sqlite3_stmt **ppsVar4;
  u8 **ppuVar5;
  char *pcVar6;
  char *p_00;
  char *p_01;
  char *p_02;
  char *p_03;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  bool local_112;
  bool local_111;
  char *local_e0;
  char *zRbuRowid_1;
  char *zRbuRowid;
  char *zNewlist;
  char *zOldlist;
  char *zWhere_1;
  char *zBindings;
  char *zWrite;
  char *zTbl_1;
  char *pcStack_98;
  int bRbuRowid;
  char *zSql;
  char *pcStack_88;
  int nBind;
  char *zPart;
  char *zBind;
  char *zWhere;
  char *zImposterPK;
  char *zImposterCols;
  char *zTbl;
  char *zLimit;
  char *zIdx;
  char **pz;
  char *zCollist;
  int tnum;
  int nOffset_local;
  RbuObjIter *pIter_local;
  sqlite3rbu *p_local;
  
  pIter_local = (RbuObjIter *)p;
  if ((pIter->pSelect == (sqlite3_stmt *)0x0) &&
     (zCollist._4_4_ = nOffset, _tnum = pIter, iVar2 = rbuObjIterCacheTableInfo(p,pIter), iVar2 == 0
     )) {
    zCollist._0_4_ = _tnum->iTnum;
    pz = (char **)0x0;
    zIdx = (char *)&pIter_local->abIndexed;
    zLimit = _tnum->zIdx;
    zTbl = (char *)0x0;
    if ((zCollist._4_4_ != 0) &&
       (zTbl = sqlite3_mprintf(" LIMIT -1 OFFSET %d",(ulong)zCollist._4_4_), zTbl == (char *)0x0)) {
      *(undefined4 *)&pIter_local->abNotNull = 7;
    }
    if (zLimit == (char *)0x0) {
      local_111 = true;
      if ((_tnum->eType != 5) && (local_111 = true, _tnum->eType != 1)) {
        local_112 = false;
        if (_tnum->eType == 3) {
          local_112 = pIter_local->azTblCol == (char **)0x0;
        }
        local_111 = local_112;
      }
      uVar3 = (uint)local_111;
      pcVar6 = _tnum->zTbl;
      p_00 = rbuObjIterGetBindlist((sqlite3rbu *)pIter_local,_tnum->nTblCol + uVar3);
      p_01 = rbuObjIterGetWhere((sqlite3rbu *)pIter_local,_tnum);
      p_02 = rbuObjIterGetOldlist((sqlite3rbu *)pIter_local,_tnum,"old");
      p_03 = rbuObjIterGetOldlist((sqlite3rbu *)pIter_local,_tnum,"new");
      pz = (char **)rbuObjIterGetCollist((sqlite3rbu *)pIter_local,_tnum);
      _tnum->nCol = _tnum->nTblCol;
      rbuCreateImposterTable((sqlite3rbu *)pIter_local,_tnum);
      rbuCreateImposterTable2((sqlite3rbu *)pIter_local,_tnum);
      pcVar9 = zIdx;
      pcVar7 = "rbu_imp_";
      if (_tnum->eType == 5) {
        pcVar7 = "";
      }
      if (*(int *)&pIter_local->abNotNull == 0) {
        psVar1 = (sqlite3 *)pIter_local->pIdxIter;
        ppsVar4 = &_tnum->pInsert;
        pcVar8 = "";
        if (uVar3 != 0) {
          pcVar8 = ", _rowid_";
        }
        pcVar8 = sqlite3_mprintf("INSERT INTO \"%s%w\"(%s%s) VALUES(%s)",pcVar7,pcVar6,pz,pcVar8,
                                 p_00);
        iVar2 = prepareFreeAndCollectError(psVar1,ppsVar4,(char **)pcVar9,pcVar8);
        *(int *)&pIter_local->abNotNull = iVar2;
      }
      pcVar9 = zIdx;
      if ((pIter_local->azTblCol != (char **)0x0) && (*(int *)&pIter_local->abNotNull == 0)) {
        psVar1 = (sqlite3 *)pIter_local->pIdxIter;
        ppsVar4 = &_tnum->pDelete;
        pcVar8 = sqlite3_mprintf("DELETE FROM \"%s%w\" WHERE %s",pcVar7,pcVar6,p_01);
        iVar2 = prepareFreeAndCollectError(psVar1,ppsVar4,(char **)pcVar9,pcVar8);
        *(int *)&pIter_local->abNotNull = iVar2;
      }
      if ((pIter_local->azTblCol != (char **)0x0) && (_tnum->abIndexed != (u8 *)0x0)) {
        zRbuRowid_1 = "";
        if ((_tnum->eType == 3) || (_tnum->eType == 1)) {
          zRbuRowid_1 = ", rbu_rowid";
        }
        pcVar9 = "";
        if (_tnum->eType == 3) {
          pcVar9 = ", 0 AS rbu_rowid";
        }
        rbuMPrintfExec((sqlite3rbu *)pIter_local,*(sqlite3 **)&pIter_local->nTblCol,
                       "CREATE TABLE IF NOT EXISTS %s.\'rbu_tmp_%q\' AS SELECT *%s FROM \'%q\' WHERE 0;"
                       ,&pIter_local->abTblPk,_tnum->zDataTbl,pcVar9,_tnum->zDataTbl);
        pcVar9 = pcVar7;
        pcVar8 = pcVar6;
        pcVar10 = p_02;
        pcVar11 = pcVar7;
        pcVar12 = pcVar6;
        pcVar13 = p_03;
        rbuMPrintfExec((sqlite3rbu *)pIter_local,(sqlite3 *)pIter_local->pIdxIter,
                       "CREATE TEMP TRIGGER rbu_delete_tr BEFORE DELETE ON \"%s%w\" BEGIN   SELECT rbu_tmp_insert(3, %s);END;CREATE TEMP TRIGGER rbu_update1_tr BEFORE UPDATE ON \"%s%w\" BEGIN   SELECT rbu_tmp_insert(3, %s);END;CREATE TEMP TRIGGER rbu_update2_tr AFTER UPDATE ON \"%s%w\" BEGIN   SELECT rbu_tmp_insert(4, %s);END;"
                       ,pcVar7,pcVar6,p_02,pcVar7,pcVar6,p_02,pcVar7,pcVar6,p_03);
        if ((_tnum->eType == 3) || (_tnum->eType == 1)) {
          rbuMPrintfExec((sqlite3rbu *)pIter_local,(sqlite3 *)pIter_local->pIdxIter,
                         "CREATE TEMP TRIGGER rbu_insert_tr AFTER INSERT ON \"%s%w\" BEGIN   SELECT rbu_tmp_insert(0, %s);END;"
                         ,pcVar7,pcVar6,p_03,pcVar9,pcVar8,pcVar10,pcVar11,pcVar12,pcVar13);
        }
        rbuObjIterPrepareTmpInsert((sqlite3rbu *)pIter_local,_tnum,(char *)pz,zRbuRowid_1);
      }
      pcVar6 = zIdx;
      if (*(int *)&pIter_local->abNotNull == 0) {
        local_e0 = "";
        if ((uVar3 != 0) && (local_e0 = ",rbu_rowid", pIter_local->azTblCol == (char **)0x0)) {
          local_e0 = ",_rowid_ ";
        }
        psVar1 = *(sqlite3 **)&pIter_local->nTblCol;
        ppsVar4 = &_tnum->pSelect;
        pcVar9 = "";
        if (pIter_local->azTblCol == (char **)0x0) {
          pcVar9 = "0 AS ";
        }
        pcVar9 = sqlite3_mprintf("SELECT %s,%s rbu_control%s FROM \'%q\'%s",pz,pcVar9,local_e0,
                                 _tnum->zDataTbl,zTbl);
        iVar2 = prepareFreeAndCollectError(psVar1,ppsVar4,(char **)pcVar6,pcVar9);
        *(int *)&pIter_local->abNotNull = iVar2;
      }
      sqlite3_free(p_01);
      sqlite3_free(p_02);
      sqlite3_free(p_03);
      sqlite3_free(p_00);
    }
    else {
      zImposterCols = _tnum->zTbl;
      zImposterPK = (char *)0x0;
      zWhere = (char *)0x0;
      zBind = (char *)0x0;
      zPart = (char *)0x0;
      pcStack_88 = (char *)0x0;
      zSql._4_4_ = 0;
      pz = (char **)rbuObjIterGetIndexCols
                              ((sqlite3rbu *)pIter_local,_tnum,&zImposterPK,&zWhere,&zBind,
                               (int *)((long)&zSql + 4));
      zPart = rbuObjIterGetBindlist((sqlite3rbu *)pIter_local,zSql._4_4_);
      pcStack_88 = rbuObjIterGetIndexWhere((sqlite3rbu *)pIter_local,_tnum);
      sqlite3_test_control(0x19,pIter_local->pIdxIter,"main",0,1);
      sqlite3_test_control(0x19,pIter_local->pIdxIter,"main",1,(ulong)(uint)zCollist);
      rbuMPrintfExec((sqlite3rbu *)pIter_local,(sqlite3 *)pIter_local->pIdxIter,
                     "CREATE TABLE \"rbu_imp_%w\"( %s, PRIMARY KEY( %s ) ) WITHOUT ROWID",
                     zImposterCols,zImposterPK,zWhere);
      sqlite3_test_control(0x19,pIter_local->pIdxIter,"main",0);
      _tnum->nCol = zSql._4_4_;
      if (*(int *)&pIter_local->abNotNull == 0) {
        psVar1 = (sqlite3 *)pIter_local->pIdxIter;
        ppsVar4 = &_tnum->pInsert;
        ppuVar5 = &pIter_local->abIndexed;
        pcVar6 = sqlite3_mprintf("INSERT INTO \"rbu_imp_%w\" VALUES(%s)",zImposterCols,zPart);
        iVar2 = prepareFreeAndCollectError(psVar1,ppsVar4,(char **)ppuVar5,pcVar6);
        *(int *)&pIter_local->abNotNull = iVar2;
      }
      if ((pIter_local->azTblCol != (char **)0x0) && (*(int *)&pIter_local->abNotNull == 0)) {
        psVar1 = (sqlite3 *)pIter_local->pIdxIter;
        ppsVar4 = &_tnum->pDelete;
        ppuVar5 = &pIter_local->abIndexed;
        pcVar6 = sqlite3_mprintf("DELETE FROM \"rbu_imp_%w\" WHERE %s",zImposterCols,zBind);
        iVar2 = prepareFreeAndCollectError(psVar1,ppsVar4,(char **)ppuVar5,pcVar6);
        *(int *)&pIter_local->abNotNull = iVar2;
      }
      if (*(int *)&pIter_local->abNotNull == 0) {
        if (pIter_local->azTblCol == (char **)0x0) {
          pcStack_98 = sqlite3_mprintf("SELECT %s, 0 AS rbu_control FROM \'%q\' %s ORDER BY %s%s",pz
                                       ,_tnum->zDataTbl,pcStack_88,pz,zTbl);
        }
        else if ((_tnum->eType == 3) || (_tnum->eType == 1)) {
          pcStack_98 = sqlite3_mprintf("SELECT %s, rbu_control FROM %s.\'rbu_tmp_%q\' %s ORDER BY %s%s"
                                       ,pz,&pIter_local->abTblPk,_tnum->zDataTbl,pcStack_88,pz,zTbl)
          ;
        }
        else {
          pcVar6 = "WHERE";
          if (pcStack_88 != (char *)0x0) {
            pcVar6 = "AND";
          }
          pcStack_98 = sqlite3_mprintf("SELECT %s, rbu_control FROM %s.\'rbu_tmp_%q\' %s UNION ALL SELECT %s, rbu_control FROM \'%q\' %s %s typeof(rbu_control)=\'integer\' AND rbu_control!=1 ORDER BY %s%s"
                                       ,pz,&pIter_local->abTblPk,_tnum->zDataTbl,pcStack_88,pz,
                                       _tnum->zDataTbl,pcStack_88,pcVar6,pz,zTbl);
        }
        iVar2 = prepareFreeAndCollectError
                          (*(sqlite3 **)&pIter_local->nTblCol,&_tnum->pSelect,(char **)zIdx,
                           pcStack_98);
        *(int *)&pIter_local->abNotNull = iVar2;
      }
      sqlite3_free(zImposterPK);
      sqlite3_free(zWhere);
      sqlite3_free(zBind);
      sqlite3_free(zPart);
      sqlite3_free(pcStack_88);
    }
    sqlite3_free(pz);
    sqlite3_free(zTbl);
  }
  return *(int *)&pIter_local->abNotNull;
}

Assistant:

static int rbuObjIterPrepareAll(
  sqlite3rbu *p, 
  RbuObjIter *pIter,
  int nOffset                     /* Add "LIMIT -1 OFFSET $nOffset" to SELECT */
){
  assert( pIter->bCleanup==0 );
  if( pIter->pSelect==0 && rbuObjIterCacheTableInfo(p, pIter)==SQLITE_OK ){
    const int tnum = pIter->iTnum;
    char *zCollist = 0;           /* List of indexed columns */
    char **pz = &p->zErrmsg;
    const char *zIdx = pIter->zIdx;
    char *zLimit = 0;

    if( nOffset ){
      zLimit = sqlite3_mprintf(" LIMIT -1 OFFSET %d", nOffset);
      if( !zLimit ) p->rc = SQLITE_NOMEM;
    }

    if( zIdx ){
      const char *zTbl = pIter->zTbl;
      char *zImposterCols = 0;    /* Columns for imposter table */
      char *zImposterPK = 0;      /* Primary key declaration for imposter */
      char *zWhere = 0;           /* WHERE clause on PK columns */
      char *zBind = 0;
      char *zPart = 0;
      int nBind = 0;

      assert( pIter->eType!=RBU_PK_VTAB );
      zCollist = rbuObjIterGetIndexCols(
          p, pIter, &zImposterCols, &zImposterPK, &zWhere, &nBind
      );
      zBind = rbuObjIterGetBindlist(p, nBind);
      zPart = rbuObjIterGetIndexWhere(p, pIter);

      /* Create the imposter table used to write to this index. */
      sqlite3_test_control(SQLITE_TESTCTRL_IMPOSTER, p->dbMain, "main", 0, 1);
      sqlite3_test_control(SQLITE_TESTCTRL_IMPOSTER, p->dbMain, "main", 1,tnum);
      rbuMPrintfExec(p, p->dbMain,
          "CREATE TABLE \"rbu_imp_%w\"( %s, PRIMARY KEY( %s ) ) WITHOUT ROWID",
          zTbl, zImposterCols, zImposterPK
      );
      sqlite3_test_control(SQLITE_TESTCTRL_IMPOSTER, p->dbMain, "main", 0, 0);

      /* Create the statement to insert index entries */
      pIter->nCol = nBind;
      if( p->rc==SQLITE_OK ){
        p->rc = prepareFreeAndCollectError(
            p->dbMain, &pIter->pInsert, &p->zErrmsg,
          sqlite3_mprintf("INSERT INTO \"rbu_imp_%w\" VALUES(%s)", zTbl, zBind)
        );
      }

      /* And to delete index entries */
      if( rbuIsVacuum(p)==0 && p->rc==SQLITE_OK ){
        p->rc = prepareFreeAndCollectError(
            p->dbMain, &pIter->pDelete, &p->zErrmsg,
          sqlite3_mprintf("DELETE FROM \"rbu_imp_%w\" WHERE %s", zTbl, zWhere)
        );
      }

      /* Create the SELECT statement to read keys in sorted order */
      if( p->rc==SQLITE_OK ){
        char *zSql;
        if( rbuIsVacuum(p) ){
          zSql = sqlite3_mprintf(
              "SELECT %s, 0 AS rbu_control FROM '%q' %s ORDER BY %s%s",
              zCollist, 
              pIter->zDataTbl,
              zPart, zCollist, zLimit
          );
        }else

        if( pIter->eType==RBU_PK_EXTERNAL || pIter->eType==RBU_PK_NONE ){
          zSql = sqlite3_mprintf(
              "SELECT %s, rbu_control FROM %s.'rbu_tmp_%q' %s ORDER BY %s%s",
              zCollist, p->zStateDb, pIter->zDataTbl,
              zPart, zCollist, zLimit
          );
        }else{
          zSql = sqlite3_mprintf(
              "SELECT %s, rbu_control FROM %s.'rbu_tmp_%q' %s "
              "UNION ALL "
              "SELECT %s, rbu_control FROM '%q' "
              "%s %s typeof(rbu_control)='integer' AND rbu_control!=1 "
              "ORDER BY %s%s",
              zCollist, p->zStateDb, pIter->zDataTbl, zPart,
              zCollist, pIter->zDataTbl, 
              zPart,
              (zPart ? "AND" : "WHERE"),
              zCollist, zLimit
          );
        }
        p->rc = prepareFreeAndCollectError(p->dbRbu, &pIter->pSelect, pz, zSql);
      }

      sqlite3_free(zImposterCols);
      sqlite3_free(zImposterPK);
      sqlite3_free(zWhere);
      sqlite3_free(zBind);
      sqlite3_free(zPart);
    }else{
      int bRbuRowid = (pIter->eType==RBU_PK_VTAB)
                    ||(pIter->eType==RBU_PK_NONE)
                    ||(pIter->eType==RBU_PK_EXTERNAL && rbuIsVacuum(p));
      const char *zTbl = pIter->zTbl;       /* Table this step applies to */
      const char *zWrite;                   /* Imposter table name */

      char *zBindings = rbuObjIterGetBindlist(p, pIter->nTblCol + bRbuRowid);
      char *zWhere = rbuObjIterGetWhere(p, pIter);
      char *zOldlist = rbuObjIterGetOldlist(p, pIter, "old");
      char *zNewlist = rbuObjIterGetOldlist(p, pIter, "new");

      zCollist = rbuObjIterGetCollist(p, pIter);
      pIter->nCol = pIter->nTblCol;

      /* Create the imposter table or tables (if required). */
      rbuCreateImposterTable(p, pIter);
      rbuCreateImposterTable2(p, pIter);
      zWrite = (pIter->eType==RBU_PK_VTAB ? "" : "rbu_imp_");

      /* Create the INSERT statement to write to the target PK b-tree */
      if( p->rc==SQLITE_OK ){
        p->rc = prepareFreeAndCollectError(p->dbMain, &pIter->pInsert, pz,
            sqlite3_mprintf(
              "INSERT INTO \"%s%w\"(%s%s) VALUES(%s)", 
              zWrite, zTbl, zCollist, (bRbuRowid ? ", _rowid_" : ""), zBindings
            )
        );
      }

      /* Create the DELETE statement to write to the target PK b-tree.
      ** Because it only performs INSERT operations, this is not required for
      ** an rbu vacuum handle.  */
      if( rbuIsVacuum(p)==0 && p->rc==SQLITE_OK ){
        p->rc = prepareFreeAndCollectError(p->dbMain, &pIter->pDelete, pz,
            sqlite3_mprintf(
              "DELETE FROM \"%s%w\" WHERE %s", zWrite, zTbl, zWhere
            )
        );
      }

      if( rbuIsVacuum(p)==0 && pIter->abIndexed ){
        const char *zRbuRowid = "";
        if( pIter->eType==RBU_PK_EXTERNAL || pIter->eType==RBU_PK_NONE ){
          zRbuRowid = ", rbu_rowid";
        }

        /* Create the rbu_tmp_xxx table and the triggers to populate it. */
        rbuMPrintfExec(p, p->dbRbu,
            "CREATE TABLE IF NOT EXISTS %s.'rbu_tmp_%q' AS "
            "SELECT *%s FROM '%q' WHERE 0;"
            , p->zStateDb, pIter->zDataTbl
            , (pIter->eType==RBU_PK_EXTERNAL ? ", 0 AS rbu_rowid" : "")
            , pIter->zDataTbl
        );

        rbuMPrintfExec(p, p->dbMain,
            "CREATE TEMP TRIGGER rbu_delete_tr BEFORE DELETE ON \"%s%w\" "
            "BEGIN "
            "  SELECT rbu_tmp_insert(3, %s);"
            "END;"

            "CREATE TEMP TRIGGER rbu_update1_tr BEFORE UPDATE ON \"%s%w\" "
            "BEGIN "
            "  SELECT rbu_tmp_insert(3, %s);"
            "END;"

            "CREATE TEMP TRIGGER rbu_update2_tr AFTER UPDATE ON \"%s%w\" "
            "BEGIN "
            "  SELECT rbu_tmp_insert(4, %s);"
            "END;",
            zWrite, zTbl, zOldlist,
            zWrite, zTbl, zOldlist,
            zWrite, zTbl, zNewlist
        );

        if( pIter->eType==RBU_PK_EXTERNAL || pIter->eType==RBU_PK_NONE ){
          rbuMPrintfExec(p, p->dbMain,
              "CREATE TEMP TRIGGER rbu_insert_tr AFTER INSERT ON \"%s%w\" "
              "BEGIN "
              "  SELECT rbu_tmp_insert(0, %s);"
              "END;",
              zWrite, zTbl, zNewlist
          );
        }

        rbuObjIterPrepareTmpInsert(p, pIter, zCollist, zRbuRowid);
      }

      /* Create the SELECT statement to read keys from data_xxx */
      if( p->rc==SQLITE_OK ){
        const char *zRbuRowid = "";
        if( bRbuRowid ){
          zRbuRowid = rbuIsVacuum(p) ? ",_rowid_ " : ",rbu_rowid";
        }
        p->rc = prepareFreeAndCollectError(p->dbRbu, &pIter->pSelect, pz,
            sqlite3_mprintf(
              "SELECT %s,%s rbu_control%s FROM '%q'%s", 
              zCollist, 
              (rbuIsVacuum(p) ? "0 AS " : ""),
              zRbuRowid,
              pIter->zDataTbl, zLimit
            )
        );
      }

      sqlite3_free(zWhere);
      sqlite3_free(zOldlist);
      sqlite3_free(zNewlist);
      sqlite3_free(zBindings);
    }
    sqlite3_free(zCollist);
    sqlite3_free(zLimit);
  }
  
  return p->rc;
}